

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

int check_stored_host_key(char *hostname,int port,char *keytype,char *key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  size_t sVar4;
  char *pcVar5;
  char porttext [20];
  
  iVar2 = 1;
  pcVar3 = make_filename(1,(char *)0x0);
  __stream = fopen(pcVar3,"r");
  safefree(pcVar3);
  if (__stream != (FILE *)0x0) {
    do {
      pcVar3 = fgetline((FILE *)__stream);
      if (pcVar3 == (char *)0x0) {
        iVar2 = 1;
        break;
      }
      sVar4 = strcspn(pcVar3,"\n");
      pcVar3[sVar4] = '\0';
      sVar4 = strlen(keytype);
      sVar4 = (size_t)(int)sVar4;
      iVar1 = strncmp(pcVar3,keytype,sVar4);
      iVar2 = 1;
      if ((iVar1 == 0) && (pcVar3[sVar4] == '@')) {
        pcVar5 = pcVar3 + sVar4 + 1;
        sprintf(porttext,"%d",(ulong)(uint)port);
        sVar4 = strlen(porttext);
        sVar4 = (size_t)(int)sVar4;
        iVar1 = strncmp(pcVar5,porttext,sVar4);
        iVar2 = 1;
        if ((iVar1 == 0) && (pcVar5[sVar4] == ':')) {
          pcVar5 = pcVar5 + sVar4 + 1;
          sVar4 = strlen(hostname);
          sVar4 = (size_t)(int)sVar4;
          iVar1 = strncmp(pcVar5,hostname,sVar4);
          iVar2 = 1;
          if ((iVar1 == 0) && (pcVar5[sVar4] == ' ')) {
            iVar2 = strcmp(pcVar5 + sVar4 + 1,key);
            iVar2 = (uint)(iVar2 != 0) * 2;
          }
        }
      }
      safefree(pcVar3);
    } while (iVar2 == 1);
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

int check_stored_host_key(const char *hostname, int port,
                          const char *keytype, const char *key)
{
    FILE *fp;
    char *filename;
    char *line;
    int ret;

    filename = make_filename(INDEX_HOSTKEYS, NULL);
    fp = fopen(filename, "r");
    sfree(filename);
    if (!fp)
        return 1;                      /* key does not exist */

    ret = 1;
    while ( (line = fgetline(fp)) ) {
        int i;
        char *p = line;
        char porttext[20];

        line[strcspn(line, "\n")] = '\0';   /* strip trailing newline */

        i = strlen(keytype);
        if (strncmp(p, keytype, i))
            goto done;
        p += i;

        if (*p != '@')
            goto done;
        p++;

        sprintf(porttext, "%d", port);
        i = strlen(porttext);
        if (strncmp(p, porttext, i))
            goto done;
        p += i;

        if (*p != ':')
            goto done;
        p++;

        i = strlen(hostname);
        if (strncmp(p, hostname, i))
            goto done;
        p += i;

        if (*p != ' ')
            goto done;
        p++;

        /*
         * Found the key. Now just work out whether it's the right
         * one or not.
         */
        if (!strcmp(p, key))
            ret = 0;                   /* key matched OK */
        else
            ret = 2;                   /* key mismatch */

        done:
        sfree(line);
        if (ret != 1)
            break;
    }

    fclose(fp);
    return ret;
}